

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O1

void __thiscall Assimp::BVHLoader::~BVHLoader(BVHLoader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_0082e8f0;
  std::vector<Assimp::BVHLoader::Node,_std::allocator<Assimp::BVHLoader::Node>_>::~vector
            (&this->mNodes);
  pcVar2 = (this->mBuffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 != (pointer)0x0) {
    operator_delete(pcVar2,(long)(this->mBuffer).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar2);
  }
  pcVar3 = (this->mFileName)._M_dataplus._M_p;
  paVar1 = &(this->mFileName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  BaseImporter::~BaseImporter(&this->super_BaseImporter);
  return;
}

Assistant:

BVHLoader::~BVHLoader()
{}